

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::addFieldName(DataDictionary *this,int field,string *name)

{
  mapped_type *pmVar1;
  ConfigError *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar2;
  int field_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  field_local = field;
  std::__cxx11::string::string((string *)&local_70,(string *)name);
  local_70.second = field;
  pVar2 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)(this + 0x250),&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(this + 0x220),&field_local);
    std::__cxx11::string::_M_assign((string *)pmVar1);
    return;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_48,"Field named ",name);
  std::operator+(&local_70.first,&local_48," defined multiple times");
  ConfigError::ConfigError(this_00,&local_70.first);
  __cxa_throw(this_00,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

void addFieldName(int field, const std::string &name) {
    if (m_names.insert(std::make_pair(name, field)).second == false) {
      throw ConfigError("Field named " + name + " defined multiple times");
    }
    m_fieldNames[field] = name;
  }